

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_transport.c
# Opt level: O0

int set_socket_non_blocking(int socket)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long in_FS_OFFSET;
  int flags;
  int socket_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = fcntl(socket,3);
  if (uVar2 == 0xffffffff) {
    flags = -1;
  }
  else {
    iVar3 = fcntl(socket,4,(ulong)(uVar2 | 0x800));
    if (iVar3 == -1) {
      flags = -1;
    }
    else {
      flags = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return flags;
  }
  __stack_chk_fail();
}

Assistant:

static int set_socket_non_blocking(int socket)
{
	int flags = fcntl(socket, F_GETFL);

	if (flags == -1)
		return TR_ERROR;

	flags |= O_NONBLOCK;

	if (fcntl(socket, F_SETFL, flags) == -1)
		return TR_ERROR;

	return TR_SUCCESS;
}